

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O1

void __thiscall cfd::core::Psbt::ClearTxInSignData(Psbt *this,uint32_t index)

{
  long lVar1;
  undefined8 *puVar2;
  void *__s;
  long lVar3;
  undefined4 in_register_00000034;
  long lVar4;
  ulong uVar5;
  
  (*this->_vptr_Psbt[2])(this,CONCAT44(in_register_00000034,index),0xb19,"ClearTxInSignData");
  lVar4 = *(long *)((long)this->wally_psbt_pointer_ + 0x10);
  lVar3 = (ulong)index * 0x110;
  lVar1 = lVar4 + lVar3;
  __s = *(void **)(lVar4 + 0x10 + lVar3);
  if (__s != (void *)0x0) {
    memset(__s,0,*(size_t *)(lVar1 + 0x18));
    FreeWallyBuffer(*(void **)(lVar1 + 0x10));
    *(undefined8 *)(lVar4 + lVar3 + 0x10) = 0;
    *(undefined8 *)(lVar4 + lVar3 + 0x18) = 0;
  }
  if (*(void **)(lVar1 + 0x20) != (void *)0x0) {
    memset(*(void **)(lVar1 + 0x20),0,*(size_t *)(lVar1 + 0x28));
    FreeWallyBuffer(*(void **)(lVar1 + 0x20));
    *(undefined8 *)(lVar1 + 0x20) = 0;
    *(undefined8 *)(lVar1 + 0x28) = 0;
  }
  if (*(long *)(lVar1 + 0x50) != 0) {
    lVar4 = 0;
    uVar5 = 0;
    do {
      lVar3 = *(long *)(lVar1 + 0x48);
      memset(*(void **)(lVar3 + lVar4),0,*(size_t *)(lVar3 + 8 + lVar4));
      memset(*(void **)(lVar3 + 0x10 + lVar4),0,*(size_t *)(lVar3 + 0x18 + lVar4));
      FreeWallyBuffer(*(void **)(lVar3 + lVar4));
      FreeWallyBuffer(*(void **)(lVar3 + 0x10 + lVar4));
      puVar2 = (undefined8 *)(lVar3 + 0x10 + lVar4);
      *puVar2 = 0;
      puVar2[1] = 0;
      *(undefined8 *)(lVar3 + lVar4) = 0;
      ((undefined8 *)(lVar3 + lVar4))[1] = 0;
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x20;
    } while (uVar5 < *(ulong *)(lVar1 + 0x50));
  }
  *(undefined8 *)(lVar1 + 0x50) = 0;
  if (*(long *)(lVar1 + 0x68) != 0) {
    lVar4 = 0;
    uVar5 = 0;
    do {
      lVar3 = *(long *)(lVar1 + 0x60);
      memset(*(void **)(lVar3 + lVar4),0,*(size_t *)(lVar3 + 8 + lVar4));
      memset(*(void **)(lVar3 + 0x10 + lVar4),0,*(size_t *)(lVar3 + 0x18 + lVar4));
      FreeWallyBuffer(*(void **)(lVar3 + lVar4));
      FreeWallyBuffer(*(void **)(lVar3 + 0x10 + lVar4));
      puVar2 = (undefined8 *)(lVar3 + 0x10 + lVar4);
      *puVar2 = 0;
      puVar2[1] = 0;
      *(undefined8 *)(lVar3 + lVar4) = 0;
      ((undefined8 *)(lVar3 + lVar4))[1] = 0;
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x20;
    } while (uVar5 < *(ulong *)(lVar1 + 0x68));
  }
  *(undefined8 *)(lVar1 + 0x68) = 0;
  *(undefined4 *)(lVar1 + 0x90) = 0;
  return;
}

Assistant:

void Psbt::ClearTxInSignData(uint32_t index) {
  CheckTxInIndex(index, __LINE__, __FUNCTION__);
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  struct wally_psbt_input *input = &psbt_pointer->inputs[index];

  if (input->redeem_script != nullptr) {
    memset(input->redeem_script, 0, input->redeem_script_len);
    FreeWallyBuffer(input->redeem_script);
    input->redeem_script_len = 0;
    input->redeem_script = nullptr;
  }
  if (input->witness_script != nullptr) {
    memset(input->witness_script, 0, input->witness_script_len);
    FreeWallyBuffer(input->witness_script);
    input->witness_script_len = 0;
    input->witness_script = nullptr;
  }
  for (size_t idx = 0; idx < input->keypaths.num_items; ++idx) {
    auto keypath = &input->keypaths.items[idx];
    memset(keypath->key, 0, keypath->key_len);
    memset(keypath->value, 0, keypath->value_len);
    FreeWallyBuffer(keypath->key);
    FreeWallyBuffer(keypath->value);
    memset(keypath, 0, sizeof(*keypath));
  }
  input->keypaths.num_items = 0;
  for (size_t idx = 0; idx < input->signatures.num_items; ++idx) {
    auto sig = &input->signatures.items[idx];
    memset(sig->key, 0, sig->key_len);
    memset(sig->value, 0, sig->value_len);
    FreeWallyBuffer(sig->key);
    FreeWallyBuffer(sig->value);
    memset(sig, 0, sizeof(*sig));
  }
  input->signatures.num_items = 0;
  input->sighash = 0;
}